

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O1

void main(void)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  char cfgname [14];
  char acStack_28 [16];
  
  builtin_strncpy(acStack_28 + 8,"s.cfg",6);
  builtin_strncpy(acStack_28,"fsnav_in",8);
  puts("fsnav_ins has started\n----");
  __stream = fopen(acStack_28,"r");
  if (__stream == (FILE *)0x0) {
    pcVar4 = "error: couldn\'t open configuration file \'%s\'.\n";
  }
  else {
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    uVar5 = (uint)lVar3;
    if (-1 < (int)uVar5) {
      fseek(__stream,0,0);
      if (0xfff < (int)uVar5) {
        printf("error: configuration \'%s\' contains more than allowed %d characters.\n",acStack_28,
               0xfff);
        return;
      }
      pcVar4 = (char *)calloc((ulong)(uVar5 & 0x7fffffff) + 2,1);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "error: couldn\'t allocate memory for the configuration.";
      }
      else {
        uVar6 = 0;
        do {
          iVar2 = fgetc(__stream);
          if ((char)iVar2 == -1) goto LAB_00109efc;
          pcVar4[uVar6] = (char)iVar2;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0xfff);
        uVar6 = 0xfff;
LAB_00109efc:
        pcVar4[uVar6 & 0xffffffff] = '\0';
        fclose(__stream);
        cVar1 = (*fsnav->add_plugin)(fsnav_ins_step_sync);
        if (((((((cVar1 == '\0') ||
                (cVar1 = (*fsnav->add_plugin)(fsnav_ins_scheduler), cVar1 == '\0')) ||
               (cVar1 = (*fsnav->add_plugin)(fsnav_ins_read_raw_input_temp), cVar1 == '\0')) ||
              ((cVar1 = (*fsnav->add_plugin)(fsnav_ins_imu_calibration_temp), cVar1 == '\0' ||
               (cVar1 = (*fsnav->add_plugin)(fsnav_ins_switch_imu_axes), cVar1 == '\0')))) ||
             ((cVar1 = (*fsnav->add_plugin)(fsnav_ins_write_sensors), cVar1 == '\0' ||
              ((cVar1 = (*fsnav->add_plugin)(fsnav_ins_gravity_normal), cVar1 == '\0' ||
               (cVar1 = (*fsnav->add_plugin)(fsnav_ins_gravity_constant), cVar1 == '\0')))))) ||
            (cVar1 = (*fsnav->add_plugin)(fsnav_ins_alignment_static), cVar1 == '\0')) ||
           ((((cVar1 = (*fsnav->add_plugin)(fsnav_ins_alignment_static_accs), cVar1 == '\0' ||
              (cVar1 = (*fsnav->add_plugin)(fsnav_ins_set_yaw_zero), cVar1 == '\0')) ||
             (cVar1 = (*fsnav->add_plugin)(fsnav_ins_attitude_rodrigues), cVar1 == '\0')) ||
            (((cVar1 = (*fsnav->add_plugin)(fsnav_ins_attitude_madgwick), cVar1 == '\0' ||
              (cVar1 = (*fsnav->add_plugin)(fsnav_ins_motion_euler), cVar1 == '\0')) ||
             ((cVar1 = (*fsnav->add_plugin)(fsnav_ins_motion_vertical_damping), cVar1 == '\0' ||
              ((cVar1 = (*fsnav->add_plugin)(fsnav_ins_write_output), cVar1 == '\0' ||
               (cVar1 = (*fsnav->add_plugin)(fsnav_ins_print_progress), cVar1 == '\0')))))))))) {
          pcVar4 = "error: couldn\'t add plugins.";
        }
        else {
          cVar1 = (*fsnav->init)(pcVar4);
          if (cVar1 == '\0') {
            pcVar4 = "error: couldn\'t initialize.";
          }
          else {
            do {
              cVar1 = (*fsnav->step)();
            } while (cVar1 != '\0');
            pcVar4 = "\n----\nfsnav_ins has terminated";
          }
        }
      }
      puts(pcVar4);
      return;
    }
    pcVar4 = "error: couldn\'t parse the size of configuration file \'%s\'.\n";
  }
  printf(pcVar4,acStack_28);
  return;
}

Assistant:

void main(void)
{
	// конфигурационный файл
	const char cfgname[] = "fsnav_ins.cfg";
	
	FILE* fp;
	int i;
	char c;
	char* cfg;

	printf("fsnav_ins has started\n----\n");

	// открытие файла с конфигурацией
	fp = fopen(cfgname, "r");
	if (fp == NULL) {
		printf("error: couldn't open configuration file '%s'.\n", cfgname);
		return;
	}

	// определение размера кофигурационного файла
	fseek(fp, 0, SEEK_END);
	i = ftell(fp);
	if (i < 0) {
		printf("error: couldn't parse the size of configuration file '%s'.\n", cfgname);
		return;
	}
	fseek(fp, 0, SEEK_SET);
	if (i >= FSNAV_INS_BUFFER_SIZE) {
		printf("error: configuration '%s' contains more than allowed %d characters.\n", cfgname, FSNAV_INS_BUFFER_SIZE-1);
		return;
	}

	// выделение памяти под кофигурацию
	cfg = (char*)calloc((size_t)i+2, sizeof(char));
	if (cfg == NULL) {
		printf("error: couldn't allocate memory for the configuration.\n");
		return;
	}

	// считывание конфигурации
	i = 0;
	while (i < FSNAV_INS_BUFFER_SIZE-1 && (c = fgetc(fp)) != EOF) {
		cfg[i] = c;
		i++;
	}
	cfg[i] = '\0';
	fclose(fp);

	// добавление частных алгоритмов
	if (   !fsnav->add_plugin(fsnav_ins_step_sync              ) // ожидание метки времени шага навигационного решения
	    || !fsnav->add_plugin(fsnav_ins_scheduler              ) // диспетчер
	    || !fsnav->add_plugin(fsnav_ins_read_raw_input_temp    ) // считывание сырых показаний датчиков, температуры и их преобразование
	    || !fsnav->add_plugin(fsnav_ins_imu_calibration_temp   ) // вычисление откалиброванных показаний датчиков (температурная модель)
	    || !fsnav->add_plugin(fsnav_ins_switch_imu_axes        ) // перестановка осей инерциальных датчиков
	    || !fsnav->add_plugin(fsnav_ins_write_sensors          ) // запись преобразованных показаний датчиков
	    || !fsnav->add_plugin(fsnav_ins_gravity_normal         ) // модель поля силы тяжести: стандартная
	    || !fsnav->add_plugin(fsnav_ins_gravity_constant       ) // модель поля силы тяжести: постоянная
	    || !fsnav->add_plugin(fsnav_ins_alignment_static       ) // начальная выставка: по акселерометрам и гироскопам
	    || !fsnav->add_plugin(fsnav_ins_alignment_static_accs  ) // начальная выставка: только по акселерометрам
	    || !fsnav->add_plugin(fsnav_ins_set_yaw_zero           ) // обнуление угла курса
	    || !fsnav->add_plugin(fsnav_ins_attitude_rodrigues     ) // ориентация
	    || !fsnav->add_plugin(fsnav_ins_attitude_madgwick      ) // фильтр Мэджвика
	    || !fsnav->add_plugin(fsnav_ins_motion_euler           ) // положение и скорость
	    || !fsnav->add_plugin(fsnav_ins_motion_vertical_damping) // демпфирование в вертикальном канале
	    || !fsnav->add_plugin(fsnav_ins_write_output           ) // запись навигационного решения
	    || !fsnav->add_plugin(fsnav_ins_print_progress         ) // вывод на экран
	    ) {
		printf("error: couldn't add plugins.\n"); // ошибка добавления частных алгоритмов
		return;									
	}

	// инициализация ядра
	if (fsnav->init((char*)cfg))
		while(fsnav->step()); // основной цикл

	// ошибка инициализации
	else {
		printf("error: couldn't initialize.\n");
		return;
	}

	printf("\n----\nfsnav_ins has terminated\n");
}